

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::FindConflicts(cmOrderDirectories *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference ppcVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  iterator __first;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_80;
  const_iterator local_78;
  const_iterator local_70;
  pair<int,_int> *local_60;
  pair<int,_int> *local_58;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_50;
  iterator last;
  ConflictList *cl;
  iterator __end1;
  iterator __begin1;
  vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
  *__range1;
  uint i;
  cmOrderDirectories *this_local;
  
  _i = this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->OriginalDirectories);
  std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
  resize(&this->ConflictGraph,sVar2);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->OriginalDirectories);
  __range1._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->DirectoryVisited,sVar2,(value_type_conflict3 *)((long)&__range1 + 4));
  __range1._0_4_ = 0;
  while( true ) {
    uVar3 = (ulong)(uint)__range1;
    sVar2 = std::
            vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ::size(&this->ConstraintEntries);
    if (sVar2 <= uVar3) break;
    ppcVar4 = std::
              vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ::operator[](&this->ConstraintEntries,(ulong)(uint)__range1);
    cmOrderDirectoriesConstraint::FindConflicts(*ppcVar4,(uint)__range1);
    __range1._0_4_ = (uint)__range1 + 1;
  }
  __end1 = std::
           vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
           ::begin(&this->ConflictGraph);
  cl = (ConflictList *)
       std::
       vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
       end(&this->ConflictGraph);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
                                *)&cl);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
               ::operator*(&__end1)->
               super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        (this_00);
    last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )last._M_current);
    local_58 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (this_00);
    local_60 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00)
    ;
    local_50 = std::
               unique<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,cmOrderDirectoriesCompare>
                         (local_58,local_60);
    __gnu_cxx::
    __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::__normal_iterator<std::pair<int,int>*>
              ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                *)&local_70,&local_50);
    local_80._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::__normal_iterator<std::pair<int,int>*>
              ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                *)&local_78,&local_80);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
              (this_00,local_70,local_78);
    __gnu_cxx::
    __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
    ::operator++(&__end1);
  }
  FindImplicitConflicts(this);
  return;
}

Assistant:

void cmOrderDirectories::FindConflicts()
{
  // Allocate the conflict graph.
  this->ConflictGraph.resize(this->OriginalDirectories.size());
  this->DirectoryVisited.resize(this->OriginalDirectories.size(), 0);

  // Find directories conflicting with each entry.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->FindConflicts(i);
  }

  // Clean up the conflict graph representation.
  for (ConflictList& cl : this->ConflictGraph) {
    // Sort the outgoing edges for each graph node so that the
    // original order will be preserved as much as possible.
    std::sort(cl.begin(), cl.end());

    // Make the edge list unique so cycle detection will be reliable.
    ConflictList::iterator last =
      std::unique(cl.begin(), cl.end(), cmOrderDirectoriesCompare());
    cl.erase(last, cl.end());
  }

  // Check items in implicit link directories.
  this->FindImplicitConflicts();
}